

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32
laszip_open_reader_stream(laszip_POINTER pointer,istream *stream,laszip_BOOL *is_compressed)

{
  BOOL BVar1;
  ByteStreamInIstreamLE *this;
  ByteStreamInIstreamBE *this_00;
  laszip_dll_struct *laszip_dll;
  laszip_BOOL *is_compressed_local;
  istream *stream_local;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else if (is_compressed == (laszip_BOOL *)0x0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"laszip_BOOL pointer \'is_compressed\' is zero");
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x238) == 0) {
    if (*(long *)((long)pointer + 0x228) == 0) {
      BVar1 = IS_LITTLE_ENDIAN();
      if (BVar1) {
        this = (ByteStreamInIstreamLE *)operator_new(0x30);
        ByteStreamInIstreamLE::ByteStreamInIstreamLE(this,stream,true);
        *(ByteStreamInIstreamLE **)((long)pointer + 0x220) = this;
      }
      else {
        this_00 = (ByteStreamInIstreamBE *)operator_new(0x30);
        ByteStreamInIstreamBE::ByteStreamInIstreamBE(this_00,stream,true);
        *(ByteStreamInIstreamBE **)((long)pointer + 0x220) = this_00;
      }
      if (*(long *)((long)pointer + 0x220) == 0) {
        snprintf((char *)((long)pointer + 0x248),0x400,"could not alloc ByteStreamInIstream");
        pointer_local._4_4_ = 1;
      }
      else {
        pointer_local._4_4_ = laszip_read_header((laszip_dll_struct *)pointer,is_compressed);
      }
    }
    else {
      snprintf((char *)((long)pointer + 0x248),0x400,"reader is already open");
      pointer_local._4_4_ = 1;
    }
  }
  else {
    snprintf((char *)((long)pointer + 0x248),0x400,"writer is already open");
    pointer_local._4_4_ = 1;
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_open_reader_stream(
    laszip_POINTER                     pointer
    , std::istream&                    stream
    , laszip_BOOL*                     is_compressed
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (is_compressed == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_BOOL pointer 'is_compressed' is zero");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is already open");
      return 1;
    }

    // open the file

    if (IS_LITTLE_ENDIAN())
      laszip_dll->streamin = new ByteStreamInIstreamLE(stream);
    else
      laszip_dll->streamin = new ByteStreamInIstreamBE(stream);

    if (laszip_dll->streamin == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "could not alloc ByteStreamInIstream");
      return 1;
    }

    return laszip_read_header(laszip_dll, is_compressed);
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_open_reader");
    return 1;
  }
}